

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O0

int __thiscall asmjit::v1_14::VirtMem::AnonymousMemory::unlink(AnonymousMemory *this,char *__name)

{
  FileType FVar1;
  uint uVar2;
  FileType type;
  char *local_58;
  char *local_48;
  
  FVar1 = this->_fileType;
  this->_fileType = kFileTypeNone;
  if (FVar1 == kFileTypeShm) {
    if ((byte)this->_tmpName < 0x1f) {
      local_48 = &this->field_0x9;
    }
    else {
      local_48 = *(char **)&this->field_0x20;
    }
    uVar2 = shm_unlink(local_48);
    this = (AnonymousMemory *)(ulong)uVar2;
  }
  else if (FVar1 == kFileTypeTmp) {
    if ((byte)this->_tmpName < 0x1f) {
      local_58 = &this->field_0x9;
    }
    else {
      local_58 = *(char **)&this->field_0x20;
    }
    uVar2 = ::unlink(local_58);
    this = (AnonymousMemory *)(ulong)uVar2;
  }
  return (int)this;
}

Assistant:

void unlink() noexcept {
    FileType type = _fileType;
    _fileType = kFileTypeNone;

#ifdef ASMJIT_HAS_SHM_OPEN
    if (type == kFileTypeShm) {
      ::shm_unlink(_tmpName.data());
      return;
    }
#endif

    if (type == kFileTypeTmp) {
      ::unlink(_tmpName.data());
      return;
    }
  }